

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

void __thiscall
t_st_generator::st_class_method
          (t_st_generator *this,ostream *out,string *cls,string *name,string *category)

{
  string local_a0;
  string local_70;
  string local_50;
  string *local_30;
  string *category_local;
  string *name_local;
  string *cls_local;
  ostream *out_local;
  t_st_generator *this_local;
  
  local_30 = category;
  category_local = name;
  name_local = cls;
  cls_local = (string *)out;
  out_local = (ostream *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)cls);
  std::__cxx11::string::string((string *)&local_70,(string *)name);
  std::__cxx11::string::string((string *)&local_a0,(string *)category);
  st_method(this,out,&local_50,&local_70,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void t_st_generator::st_class_method(std::ostream& out, string cls, string name, string category) {
  st_method(out, cls, name, category);
}